

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O1

int Ivy_ManCheckChoices(Ivy_Man_t *p)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  uint *puVar3;
  long lVar4;
  
  pVVar2 = p->pHaig->vObjs;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      puVar1 = (uint *)pVVar2->pArray[lVar4];
      if ((puVar1 != (uint *)0x0) && (puVar1[3] != 0)) {
        puVar3 = *(uint **)(puVar1 + 0x12);
        if (((ulong)puVar3 & 1) != 0) {
          __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCheck.c"
                        ,0x108,"int Ivy_ManCheckChoices(Ivy_Man_t *)");
        }
        if (puVar3 != puVar1 && puVar3 != (uint *)0x0) {
          do {
            if (1 < (int)puVar3[3]) {
              printf("Node %d has member %d in its equiv class with %d fanouts.\n",(ulong)*puVar1,
                     (ulong)*puVar3);
            }
            puVar3 = (uint *)(*(ulong *)(puVar3 + 0x12) & 0xfffffffffffffffe);
          } while ((puVar3 != (uint *)0x0) && (puVar1 != puVar3));
        }
      }
      lVar4 = lVar4 + 1;
      pVVar2 = p->pHaig->vObjs;
    } while (lVar4 < pVVar2->nSize);
  }
  return 1;
}

Assistant:

int Ivy_ManCheckChoices( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj, * pTemp;
    int i;
    Ivy_ManForEachObj( p->pHaig, pObj, i )
    {
        if ( Ivy_ObjRefs(pObj) == 0 )
            continue;
        // count the number of nodes in the loop
        assert( !Ivy_IsComplement(pObj->pEquiv) );
        for ( pTemp = pObj->pEquiv; pTemp && pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            if ( Ivy_ObjRefs(pTemp) > 1 )
                printf( "Node %d has member %d in its equiv class with %d fanouts.\n", pObj->Id, pTemp->Id, Ivy_ObjRefs(pTemp) );
    }
    return 1;
}